

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.cpp
# Opt level: O3

void __thiscall
Js::TypePath::AddSingletonInstanceFieldAt(TypePath *this,PropertyIndex index,int typePathLength)

{
  byte bVar1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  bool bVar4;
  BOOLEAN BVar5;
  bool bVar6;
  undefined4 *puVar7;
  PropertyRecord *pPVar8;
  Type pcVar9;
  undefined6 in_register_00000032;
  Data *pDVar10;
  BVIndex i;
  uint index_00;
  
  pDVar10 = (this->data).ptr;
  if (pDVar10->pathLength <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypePath.cpp"
                                ,0xbe,"(index < this->GetPathLength())",
                                "index < this->GetPathLength()");
    if (!bVar4) goto LAB_00e4f055;
    *puVar7 = 0;
    pDVar10 = (this->data).ptr;
  }
  bVar1 = pDVar10->maxInitializedLength;
  if (typePathLength < (int)(uint)bVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypePath.cpp"
                                ,0xbf,"(typePathLength >= this->GetMaxInitializedLength())",
                                "typePathLength >= this->GetMaxInitializedLength()");
    if (!bVar4) goto LAB_00e4f055;
    *puVar7 = 0;
    pDVar10 = (this->data).ptr;
    bVar1 = pDVar10->maxInitializedLength;
  }
  if (index < bVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypePath.cpp"
                                ,0xc0,"(index >= this->GetMaxInitializedLength())",
                                "index >= this->GetMaxInitializedLength()");
    if (!bVar4) goto LAB_00e4f055;
    *puVar7 = 0;
    pDVar10 = (this->data).ptr;
  }
  i = (BVIndex)CONCAT62(in_register_00000032,index);
  BVar5 = BVStatic<128UL>::Test(&pDVar10->fixedFields,i);
  if (BVar5 == '\0') {
    BVar5 = BVStatic<128UL>::Test(&((this->data).ptr)->usedFixedFields,i);
    if (BVar5 == '\0') goto LAB_00e4ef42;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar7 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypePath.cpp"
                              ,0xc1,
                              "(!this->GetData()->fixedFields.Test(index) && !this->GetData()->usedFixedFields.Test(index))"
                              ,
                              "!this->GetData()->fixedFields.Test(index) && !this->GetData()->usedFixedFields.Test(index)"
                             );
  if (!bVar4) {
LAB_00e4f055:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar7 = 0;
LAB_00e4ef42:
  SetMaxInitializedLength(this,i + 1);
  bVar4 = Phases::IsEnabled((Phases *)&DAT_015b6718,FixMethodPropsPhase);
  if ((bVar4) && (DAT_015bc46a == '\x01')) {
    pRVar2 = (this->singletonInstance).ptr;
    if (pRVar2 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      pcVar9 = (Type)0x0;
    }
    else {
      pcVar9 = (pRVar2->super_RecyclerWeakReferenceBase).strongRef;
    }
    Output::Print(L"FixedFields: TypePath::AddSingletonInstanceFieldAt: singleton = 0x%p(0x%p)\n",
                  pRVar2,pcVar9);
    Output::Print(L"   fixed fields:");
    if (((this->data).ptr)->pathLength != '\0') {
      index_00 = 0;
      do {
        pPVar8 = GetPropertyIdUnchecked(this,index_00);
        pDVar10 = (this->data).ptr;
        bVar1 = pDVar10->maxInitializedLength;
        bVar4 = GetIsFixedFieldAt(this,(PropertyIndex)index_00,(uint)pDVar10->pathLength);
        bVar6 = GetIsUsedFixedFieldAt
                          (this,(PropertyIndex)index_00,(uint)((this->data).ptr)->pathLength);
        Output::Print(L" %s %d%d%d,",pPVar8 + 1,(ulong)(index_00 < bVar1),(ulong)bVar4,(ulong)bVar6)
        ;
        index_00 = index_00 + 1;
      } while (index_00 < ((this->data).ptr)->pathLength);
    }
    Output::Print(L"\n");
    return;
  }
  return;
}

Assistant:

void TypePath::AddSingletonInstanceFieldAt(PropertyIndex index, int typePathLength)
    {
        Assert(index < this->GetPathLength());
        Assert(typePathLength >= this->GetMaxInitializedLength());
        Assert(index >= this->GetMaxInitializedLength());
        Assert(!this->GetData()->fixedFields.Test(index) && !this->GetData()->usedFixedFields.Test(index));

        this->SetMaxInitializedLength(index + 1);

        if (PHASE_VERBOSE_TRACE1(FixMethodPropsPhase))
        {
            Output::Print(_u("FixedFields: TypePath::AddSingletonInstanceFieldAt: singleton = 0x%p(0x%p)\n"),
                PointerValue(this->singletonInstance), this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr);
            Output::Print(_u("   fixed fields:"));

            for (PropertyIndex i = 0; i < GetPathLength(); i++)
            {
                Output::Print(_u(" %s %d%d%d,"), GetPropertyId(i)->GetBuffer(),
                    i < GetMaxInitializedLength() ? 1 : 0,
                    GetIsFixedFieldAt(i, GetPathLength()) ? 1 : 0,
                    GetIsUsedFixedFieldAt(i, GetPathLength()) ? 1 : 0);
            }

            Output::Print(_u("\n"));
        }
    }